

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall
c4::yml::Parser::_filter_nl<true,true>
          (Parser *this,substr r,size_t *i,size_t *pos,size_t indentation)

{
  ulong uVar1;
  anon_unknown_0 aVar2;
  char *pcVar3;
  pfn_error p_Var4;
  code *pcVar5;
  Location LVar6;
  Location LVar7;
  bool bVar8;
  undefined1 uVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  anon_unknown_0 *this_00;
  size_t *indentation_00;
  ro_substr chars;
  csubstr cVar14;
  char msg [36];
  substr r_local;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  pcVar13 = (char *)r.len;
  this_00 = (anon_unknown_0 *)r.str;
  pcVar3 = (char *)*i;
  r_local.str = (char *)this_00;
  r_local.len = (size_t)pcVar13;
  if (pcVar13 <= pcVar3) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar5 = (code *)swi(3);
        uVar9 = (*pcVar5)();
        return (bool)uVar9;
      }
    }
    handle_error(0x230d59,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  aVar2 = this_00[(long)pcVar3];
  indentation_00 = pos;
  if (indentation == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (indentation != npos)",0x24);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar5 = (code *)swi(3);
        uVar9 = (*pcVar5)();
        return (bool)uVar9;
      }
    }
    p_Var4 = (this->m_stack).m_callbacks.m_error;
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_38 = cVar14.len;
    pcStack_40 = cVar14.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7bae) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x7bae) << 0x40,8);
    LVar6.name.str = pcStack_40;
    LVar6.name.len = local_38;
    (*p_Var4)(msg,0x24,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  if (aVar2 != (anon_unknown_0)0xa) {
    builtin_strncpy(msg + 0x10,"urr == \'\\n\')",0xd);
    builtin_strncpy(msg,"check failed: (c",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar5 = (code *)swi(3);
        uVar9 = (*pcVar5)();
        return (bool)uVar9;
      }
    }
    p_Var4 = (this->m_stack).m_callbacks.m_error;
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_60 = cVar14.len;
    pcStack_68 = cVar14.str;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7baf) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x7baf) << 0x40,8);
    LVar7.name.str = pcStack_68;
    LVar7.name.len = local_60;
    (*p_Var4)(msg,0x1d,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  cVar14.len = (size_t)msg;
  cVar14.str = pcVar13;
  msg._0_8_ = pcVar3;
  sVar10 = anon_unknown_0::count_following_newlines
                     (this_00,cVar14,(size_t *)indentation,(size_t)indentation_00);
  if (sVar10 == 0) {
    chars.len = 2;
    chars.str = " \t";
    basic_substring<char>::first_not_of(&r_local,chars,(size_t)(pcVar3 + 1));
    sVar11 = *pos;
    (this->m_filter_arena).str[sVar11] = ' ';
    *pos = sVar11 + 1;
    if (((((ulong)msg._0_8_ < r_local.len) && (r_local.str[msg._0_8_] == '\\')) &&
        (uVar1 = msg._0_8_ + 1, uVar1 < r_local.len)) &&
       ((r_local.str[uVar1] == ' ' || (r_local.str[uVar1] == '\t')))) {
      msg._0_8_ = uVar1;
    }
  }
  else {
    sVar11 = *pos;
    sVar12 = sVar10;
    while (bVar8 = sVar12 != 0, sVar12 = sVar12 - 1, bVar8) {
      (this->m_filter_arena).str[sVar11] = '\n';
      sVar11 = sVar11 + 1;
    }
    *pos = sVar11;
  }
  *i = msg._0_8_ - 1;
  return sVar10 == 0;
}

Assistant:

bool Parser::_filter_nl(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfnl(fmt, ...) _c4dbgpf("filter_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfnl(...)
    #endif

    const char curr = r[*i];
    bool replaced = false;

    _RYML_CB_ASSERT(m_stack.m_callbacks, indentation != npos);
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == '\n');

    _c4dbgfnl("found newline. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
    size_t ii = *i;
    size_t numnl_following = count_following_newlines(r, &ii, indentation);
    if(numnl_following)
    {
        _c4dbgfnl("{} consecutive (empty) lines {} in the middle. totalws={}", 1+numnl_following, ii < r.len ? "in the middle" : "at the end", ii - *i);
        for(size_t j = 0; j < numnl_following; ++j)
            m_filter_arena.str[(*pos)++] = '\n';
    }
    else
    {
        if(r.first_not_of(" \t", *i+1) != npos)
        {
            m_filter_arena.str[(*pos)++] = ' ';
            _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
            replaced = true;
        }
        else
        {
            if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            {
                m_filter_arena.str[(*pos)++] = ' ';
                _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
                replaced = true;
            }
            else
            {
                _c4dbgfnl("last newline, everything else is whitespace. ii={}/{}", ii, r.len);
                *i = r.len;
            }
        }
        if C4_IF_CONSTEXPR (backslash_is_escape)
        {
            if(ii < r.len && r.str[ii] == '\\')
            {
                const char next = ii+1 < r.len ? r.str[ii+1] : '\0';
                if(next == ' ' || next == '\t')
                {
                    _c4dbgfnl("extend skip to backslash{}", "");
                    ++ii;
                }
            }
        }
    }
    *i = ii - 1; // correct for the loop increment

    #undef _c4dbgfnl

    return replaced;
}